

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O1

void uss_error(UnixSftpServer *uss,SftpReplyBuilder *reply)

{
  int __errnum;
  int *piVar1;
  char *pcVar2;
  char cVar3;
  
  piVar1 = __errno_location();
  __errnum = *piVar1;
  cVar3 = (__errnum != 1) + '\x03';
  if (__errnum == 2) {
    cVar3 = '\x02';
  }
  pcVar2 = strerror(__errnum);
  (**(code **)(uss->fdseqs + 2))(uss,cVar3,pcVar2,*(code **)(uss->fdseqs + 2));
  return;
}

Assistant:

static void uss_error(UnixSftpServer *uss, SftpReplyBuilder *reply)
{
    unsigned code = SSH_FX_FAILURE;
    switch (errno) {
      case ENOENT:
        code = SSH_FX_NO_SUCH_FILE;
        break;
      case EPERM:
        code = SSH_FX_PERMISSION_DENIED;
        break;
    }
    fxp_reply_error(reply, code, strerror(errno));
}